

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

int __thiscall wabt::Const::lane_count(Const *this)

{
  Enum EVar1;
  uint uVar2;
  
  if ((this->type_).enum_ != V128) {
    __assert_fail("type_ == Type::V128",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                  ,0x6b,"Type wabt::Const::lane_type() const");
  }
  EVar1 = (this->lane_type_).enum_;
  if ((0xfffffff8 < (uint)EVar1) && (uVar2 = EVar1 + I32U, (0x7bU >> (uVar2 & 0x1f) & 1) != 0)) {
    return *(int *)(&DAT_001df318 + (long)(int)uVar2 * 4);
  }
  abort();
}

Assistant:

int lane_count() const {
    switch (lane_type()) {
      case Type::I8:  return 16;
      case Type::I16: return 8;
      case Type::I32: return 4;
      case Type::I64: return 2;
      case Type::F32: return 4;
      case Type::F64: return 2;
      default: WABT_UNREACHABLE;
    }
  }